

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

vector<double> * __thiscall
mat_lib::vector<double>::operator/
          (vector<double> *__return_storage_ptr__,vector<double> *this,element_t rhs)

{
  ulong uVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  
  vector(__return_storage_ptr__,this->max_size__);
  uVar1 = this->max_size__;
  pdVar2 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->container__).super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pdVar3[uVar4] = pdVar2[uVar4] - rhs;
  }
  return __return_storage_ptr__;
}

Assistant:

vector operator/(const element_t rhs){
          vector<element_t> res(this->size());

          for (int i = 0; i < this->size(); ++i) {
              res.set(i,container__[i] - rhs);
          }

          return res;
      }